

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get_value<std::array<double,2ul>>(Attribute *this,array<double,_2UL> *v)

{
  double dVar1;
  value_type *pvVar2;
  optional<std::array<double,_2UL>_> ret;
  optional<std::array<double,_2UL>_> local_48;
  optional<std::array<double,_2UL>_> local_30;
  
  if (v == (array<double,_2UL> *)0x0) {
    local_48.has_value_ = false;
  }
  else {
    primvar::PrimVar::get_value<std::array<double,2ul>>(&local_48,&this->_var);
    local_30.has_value_ = local_48.has_value_;
    if (local_48.has_value_ != false) {
      local_30.contained.data.__align = local_48.contained.data.__align;
      local_30.contained._8_8_ = local_48.contained._8_8_;
      pvVar2 = nonstd::optional_lite::optional<std::array<double,_2UL>_>::value(&local_30);
      dVar1 = pvVar2->_M_elems[1];
      v->_M_elems[0] = pvVar2->_M_elems[0];
      v->_M_elems[1] = dVar1;
    }
  }
  return local_48.has_value_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }